

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::compareEqual<char[28],std::basic_string_view<char,std::char_traits<char>>>
               (char (*lhs) [28],basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  int iVar1;
  size_t __n;
  bool bVar2;
  
  __n = strlen(*lhs);
  if (__n == rhs->_M_len) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(lhs,rhs->_M_str,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }